

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

bool __thiscall slang::parsing::Token::isOnSameLine(Token *this)

{
  TriviaKind TVar1;
  char cVar2;
  pointer pTVar3;
  Trivia *t;
  pointer pTVar4;
  FullLocation *pFVar5;
  ulong uVar6;
  ulong uVar7;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar8;
  
  sVar8 = trivia(this);
  pTVar3 = sVar8._M_ptr;
  if (sVar8._M_extent._M_extent_value._M_extent_value != 0) {
    pTVar4 = pTVar3 + sVar8._M_extent._M_extent_value._M_extent_value;
    do {
      TVar1 = pTVar3->kind;
      if (TVar1 < (Directive|Whitespace)) {
        if (TVar1 == BlockComment) {
          pFVar5 = (pTVar3->field_0).fullLocation;
          if (pTVar3->hasFullLocation == true) {
            uVar6 = (pFVar5->text)._M_len;
            pFVar5 = (FullLocation *)(pFVar5->text)._M_str;
          }
          else {
            uVar6 = (ulong)(pTVar3->field_0).rawText.len;
          }
          if (uVar6 != 0) {
            uVar7 = 0;
            do {
              cVar2 = *(char *)((long)&(pFVar5->text)._M_len + uVar7);
              if (cVar2 == '\n') {
                return false;
              }
              if (cVar2 == '\r') {
                return false;
              }
              uVar7 = uVar7 + 1;
            } while (uVar6 != uVar7);
          }
        }
        else if (TVar1 == 8) {
          if (((pTVar3->field_0).syntaxNode)->kind != MacroUsage) {
            return false;
          }
        }
        else if ((0xecU >> (TVar1 & 0x1f) & 1) != 0) {
          return false;
        }
      }
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != pTVar4);
  }
  return true;
}

Assistant:

bool Token::isOnSameLine() const {
    for (auto& t : trivia()) {
        switch (t.kind) {
            case TriviaKind::LineComment:
            case TriviaKind::EndOfLine:
            case TriviaKind::SkippedSyntax:
            case TriviaKind::SkippedTokens:
            case TriviaKind::DisabledText:
                return false;
            case TriviaKind::Directive:
                if (t.syntax()->kind != SyntaxKind::MacroUsage)
                    return false;
                break;
            case TriviaKind::BlockComment:
                if (size_t offset = t.getRawText().find_first_of("\r\n");
                    offset != std::string_view::npos) {
                    return false;
                }
                break;
            default:
                break;
        }
    }
    return true;
}